

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void do_cmd_wiz_curse_item(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t curse_index;
  wchar_t power;
  object *obj;
  wchar_t update;
  char s [80];
  wchar_t local_80;
  wchar_t local_7c;
  object *local_78;
  int local_6c;
  char local_68 [88];
  
  wVar2 = cmd_get_arg_item((command_conflict *)cmd,"item",&local_78);
  if (wVar2 != L'\0') {
    _Var1 = get_item(&local_78,"Change curse on which item? ","You have nothing to change.",
                     cmd->code,(item_tester)0x0,L'\x0f');
    if (!_Var1) {
      return;
    }
    cmd_set_arg_item((command_conflict *)cmd,"item",local_78);
  }
  wVar2 = cmd_get_arg_number((command_conflict *)cmd,"index",&local_80);
  if (wVar2 != L'\0') {
    strnfmt(local_68,0x50,"0");
    _Var1 = get_string("Enter curse name or index: ",local_68,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string(local_68,&local_80);
    if (!_Var1) {
      local_80 = lookup_curse(local_68);
    }
    cmd_set_arg_number((command_conflict *)cmd,"index",local_80);
  }
  if ((L'\0' < local_80) && ((uint)local_80 < (uint)z_info->curse_max)) {
    wVar2 = cmd_get_arg_number((command_conflict *)cmd,"power",&local_7c);
    if (wVar2 != L'\0') {
      strnfmt(local_68,0x50,"0");
      _Var1 = get_string("Enter curse power (0 removes): ",local_68,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(local_68,&local_7c);
      if (!_Var1) {
        return;
      }
      cmd_set_arg_number((command_conflict *)cmd,"power",local_7c);
    }
    if (L'\xffffffff' < local_7c) {
      if (local_7c == L'\0') {
        _Var1 = remove_object_curse(local_78,local_80,false);
        if (!_Var1) {
          return;
        }
      }
      else {
        append_object_curse(local_78,local_80,local_7c);
      }
      local_6c = 0;
      wVar2 = cmd_get_arg_choice((command_conflict *)cmd,"update",&local_6c);
      if (wVar2 == L'\0' && local_6c == 0) {
        wiz_play_item_notify_changed();
      }
      else {
        wiz_play_item_standard_upkeep(player,local_78);
      }
    }
  }
  return;
}

Assistant:

void do_cmd_wiz_curse_item(struct command *cmd)
{
	struct object *obj;
	int curse_index, power;
	char s[80];
	int update;

	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK) {
		if (!get_item(&obj, "Change curse on which item? ",
				"You have nothing to change.", cmd->code,
				NULL, (USE_EQUIP | USE_INVEN | USE_QUIVER |
				USE_FLOOR))) {
			return;
		}
		cmd_set_arg_item(cmd, "item", obj);
	}

	/* Get curse. */
	if (cmd_get_arg_number(cmd, "index", &curse_index) != CMD_OK) {
		strnfmt(s, sizeof(s), "0");
		if (!get_string("Enter curse name or index: ",
				s, sizeof(s))) return;
		if (!get_int_from_string(s, &curse_index)) {
			curse_index = lookup_curse(s);
		}
		cmd_set_arg_number(cmd, "index", curse_index);
	}
	if (curse_index <= 0 || curse_index >= z_info->curse_max) {
		return;
	}

	/* Get power for curse. */
	if (cmd_get_arg_number(cmd, "power", &power) != CMD_OK) {
		strnfmt(s, sizeof(s), "0");
		if (!get_string("Enter curse power (0 removes): ", s,
				sizeof(s)) || !get_int_from_string(s, &power)) {
			return;
		}
		cmd_set_arg_number(cmd, "power", power);
	}
	if (power < 0) {
		return;
	}

	/* Apply. */
	if (power) {
		append_object_curse(obj, curse_index, power);
	} else if (!remove_object_curse(obj, curse_index, false)) {
		return;
	}

	update = 0;
	if (cmd_get_arg_choice(cmd, "update", &update) != CMD_OK || update) {
		wiz_play_item_standard_upkeep(player, obj);
	} else {
		wiz_play_item_notify_changed();
	}
}